

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTextureImageDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int textureTarget,int mipLevel
          ,int imageIndex)

{
  ostream *this_00;
  char *pcVar1;
  int iVar2;
  ostringstream result;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,"level ");
  std::ostream::operator<<(local_1a0,textureTarget);
  iVar2 = (int)this;
  if (iVar2 == 0x806f) {
    pcVar1 = " and Slice ";
  }
  else if (iVar2 == 0x8513) {
    pcVar1 = " and Face ";
  }
  else {
    if (iVar2 != 0x8c1a) goto LAB_005ae743;
    pcVar1 = " and Layer ";
  }
  this_00 = std::operator<<((ostream *)local_1a0,pcVar1);
  std::ostream::operator<<(this_00,mipLevel);
LAB_005ae743:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string getTextureImageDescription (int textureTarget, int mipLevel, int imageIndex)
{
	std::ostringstream result;
	result << "level ";
	result << mipLevel;

	switch (textureTarget)
	{
		case GL_TEXTURE_2D:			break;
		case GL_TEXTURE_3D:			result << " and Slice " << imageIndex; break;
		case GL_TEXTURE_CUBE_MAP:	result << " and Face " << imageIndex; break;
		case GL_TEXTURE_2D_ARRAY:	result << " and Layer " << imageIndex; break;
		default:
			DE_FATAL("Unsupported texture target");
			break;
	}
	return result.str();
}